

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

int jpeg_huff_decode(bitread_working_state *state,bit_buf_type get_buffer,int bits_left,
                    d_derived_tbl *htbl,int min_bits)

{
  boolean bVar1;
  long in_RCX;
  int in_EDX;
  ulong in_RSI;
  bit_buf_type in_RDI;
  int in_R8D;
  JLONG code;
  int l;
  ulong local_38;
  int local_30;
  int local_1c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar2;
  
  local_1c = in_EDX;
  if (in_EDX < in_R8D) {
    bVar1 = jpeg_fill_bit_buffer
                      ((bitread_working_state *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                       (int)(in_RSI >> 0x20),(int)in_RSI);
    if (bVar1 == 0) {
      return -1;
    }
    in_RSI = *(ulong *)(in_RDI + 0x10);
    local_1c = *(int *)(in_RDI + 0x18);
  }
  local_1c = local_1c - in_R8D;
  local_38 = (ulong)(int)((uint)(in_RSI >> ((byte)local_1c & 0x3f)) &
                         (1 << ((byte)in_R8D & 0x1f)) - 1U);
  local_30 = in_R8D;
  do {
    if ((long)local_38 <= *(long *)(in_RCX + (long)local_30 * 8)) {
      *(ulong *)(in_RDI + 0x10) = in_RSI;
      *(int *)(in_RDI + 0x18) = local_1c;
      if (local_30 < 0x11) {
        uVar2 = (uint)*(byte *)(*(long *)(in_RCX + 0x120) + 0x11 +
                               (long)((int)local_38 +
                                     (int)*(undefined8 *)(in_RCX + 0x90 + (long)local_30 * 8)));
      }
      else {
        *(undefined4 *)(**(long **)(in_RDI + 0x20) + 0x28) = 0x76;
        (**(code **)(**(long **)(in_RDI + 0x20) + 8))(*(undefined8 *)(in_RDI + 0x20),0xffffffff);
        uVar2 = 0;
      }
      return uVar2;
    }
    if (local_1c < 1) {
      bVar1 = jpeg_fill_bit_buffer
                        ((bitread_working_state *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                         (int)(in_RSI >> 0x20),(int)in_RSI);
      if (bVar1 == 0) {
        return -1;
      }
      in_RSI = *(ulong *)(in_RDI + 0x10);
      local_1c = *(int *)(in_RDI + 0x18);
    }
    local_1c = local_1c + -1;
    local_38 = (long)(int)((uint)(in_RSI >> ((byte)local_1c & 0x3f)) & 1) | local_38 << 1;
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

GLOBAL(int)
jpeg_huff_decode(bitread_working_state *state,
                 register bit_buf_type get_buffer, register int bits_left,
                 d_derived_tbl *htbl, int min_bits)
{
  register int l = min_bits;
  register JLONG code;

  /* HUFF_DECODE has determined that the code is at least min_bits */
  /* bits long, so fetch that many bits in one swoop. */

  CHECK_BIT_BUFFER(*state, l, return -1);
  code = GET_BITS(l);

  /* Collect the rest of the Huffman code one bit at a time. */
  /* This is per Figure F.16. */

  while (code > htbl->maxcode[l]) {
    code <<= 1;
    CHECK_BIT_BUFFER(*state, 1, return -1);
    code |= GET_BITS(1);
    l++;
  }

  /* Unload the local registers */
  state->get_buffer = get_buffer;
  state->bits_left = bits_left;

  /* With garbage input we may reach the sentinel value l = 17. */

  if (l > 16) {
    WARNMS(state->cinfo, JWRN_HUFF_BAD_CODE);
    return 0;                   /* fake a zero as the safest result */
  }

  return htbl->pub->huffval[(int)(code + htbl->valoffset[l])];
}